

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextBlockData>::erase_single(QFragmentMapData<QTextBlockData> *this,uint z)

{
  uint uVar1;
  quint32 qVar2;
  uint uVar3;
  QTextBlockData *pQVar4;
  uint in_ESI;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextBlockData>_1 *in_RDI;
  bool bVar5;
  uint w_2;
  uint w_1;
  uint field_4;
  uint p_1;
  uint n;
  uint field_3;
  uint c;
  uint field_2;
  uint zp;
  uint field_1;
  uint n_1;
  uint field;
  uint p;
  uint x;
  uint y;
  uint w;
  uint in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  quint32 qVar6;
  uint in_stack_ffffffffffffff5c;
  quint32 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  quint32 in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  quint32 in_stack_ffffffffffffff84;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_3c;
  uint local_38;
  uint local_30;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  uVar3 = previous((QFragmentMapData<QTextBlockData> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   in_stack_ffffffffffffff54);
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
  local_14 = in_ESI;
  if ((pQVar4->super_QFragment<3>).left == 0) {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    local_18 = (pQVar4->super_QFragment<3>).right;
  }
  else {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    if ((pQVar4->super_QFragment<3>).right == 0) {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
      local_18 = (pQVar4->super_QFragment<3>).left;
    }
    else {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
      local_14 = (pQVar4->super_QFragment<3>).right;
      while (pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14),
            (pQVar4->super_QFragment<3>).left != 0) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
        local_14 = (pQVar4->super_QFragment<3>).left;
      }
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
      local_18 = (pQVar4->super_QFragment<3>).right;
    }
  }
  if (local_14 == in_ESI) {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    local_1c = (pQVar4->super_QFragment<3>).parent;
    if (local_18 != 0) {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_18);
      (pQVar4->super_QFragment<3>).parent = local_1c;
    }
    if (local_1c == 0) {
      in_RDI->head->root = local_18;
      local_3c = in_ESI;
    }
    else {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
      if ((pQVar4->super_QFragment<3>).left == in_ESI) {
        in_stack_ffffffffffffff64 = local_18;
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
        (pQVar4->super_QFragment<3>).left = in_stack_ffffffffffffff64;
        for (local_38 = 0; local_3c = in_ESI, local_38 < 3; local_38 = local_38 + 1) {
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
          in_stack_ffffffffffffff60 = (pQVar4->super_QFragment<3>).size_array[local_38];
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
          (pQVar4->super_QFragment<3>).size_left_array[local_38] =
               (pQVar4->super_QFragment<3>).size_left_array[local_38] - in_stack_ffffffffffffff60;
        }
      }
      else {
        in_stack_ffffffffffffff5c = local_18;
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
        (pQVar4->super_QFragment<3>).right = in_stack_ffffffffffffff5c;
        local_3c = in_ESI;
      }
    }
  }
  else {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).left);
    (pQVar4->super_QFragment<3>).parent = local_14;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    qVar6 = (pQVar4->super_QFragment<3>).left;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
    (pQVar4->super_QFragment<3>).left = qVar6;
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
      qVar6 = (pQVar4->super_QFragment<3>).size_left_array[local_20];
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
      (pQVar4->super_QFragment<3>).size_left_array[local_20] = qVar6;
    }
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    if (local_14 == (pQVar4->super_QFragment<3>).right) {
      local_1c = local_14;
    }
    else {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
      local_1c = (pQVar4->super_QFragment<3>).parent;
      if (local_18 != 0) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_18);
        (pQVar4->super_QFragment<3>).parent = local_1c;
      }
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
      (pQVar4->super_QFragment<3>).left = local_18;
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
      qVar6 = (pQVar4->super_QFragment<3>).right;
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
      (pQVar4->super_QFragment<3>).right = qVar6;
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).right);
      (pQVar4->super_QFragment<3>).parent = local_14;
      local_24 = local_1c;
      while (local_24 != local_14) {
        for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
          in_stack_ffffffffffffff84 = (pQVar4->super_QFragment<3>).size_array[local_28];
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_24);
          (pQVar4->super_QFragment<3>).size_left_array[local_28] =
               (pQVar4->super_QFragment<3>).size_left_array[local_28] - in_stack_ffffffffffffff84;
        }
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_24);
        local_24 = (pQVar4->super_QFragment<3>).parent;
      }
    }
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    uVar1 = (pQVar4->super_QFragment<3>).parent;
    if (uVar1 == 0) {
      in_RDI->head->root = local_14;
    }
    else {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,uVar1);
      if ((pQVar4->super_QFragment<3>).left == in_ESI) {
        in_stack_ffffffffffffff80 = local_14;
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,uVar1);
        (pQVar4->super_QFragment<3>).left = in_stack_ffffffffffffff80;
        for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
          in_stack_ffffffffffffff7c = (pQVar4->super_QFragment<3>).size_array[local_30];
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,uVar1);
          (pQVar4->super_QFragment<3>).size_left_array[local_30] =
               (pQVar4->super_QFragment<3>).size_left_array[local_30] - in_stack_ffffffffffffff7c;
        }
      }
      else {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,uVar1);
        (pQVar4->super_QFragment<3>).right = local_14;
      }
    }
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
    (pQVar4->super_QFragment<3>).parent = uVar1;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
    qVar6 = (pQVar4->super_QFragment<3>).color;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    qVar2 = (pQVar4->super_QFragment<3>).color;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
    (pQVar4->super_QFragment<3>).color = qVar2;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    (pQVar4->super_QFragment<3>).color = qVar6;
    local_3c = in_ESI;
    local_14 = in_ESI;
  }
  while (pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_3c),
        (pQVar4->super_QFragment<3>).parent != 0) {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_3c);
    uVar1 = (pQVar4->super_QFragment<3>).parent;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,uVar1);
    bVar5 = (pQVar4->super_QFragment<3>).left == local_3c;
    local_3c = uVar1;
    if (bVar5) {
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
        qVar6 = (pQVar4->super_QFragment<3>).size_array[local_44];
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,uVar1);
        (pQVar4->super_QFragment<3>).size_left_array[local_44] =
             (pQVar4->super_QFragment<3>).size_left_array[local_44] - qVar6;
      }
    }
  }
  freeFragment((QFragmentMapData<QTextBlockData> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_14);
  if ((pQVar4->super_QFragment<3>).color == 0) {
    return uVar3;
  }
  do {
    uVar1 = local_1c;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_18);
    bVar5 = false;
    if (((pQVar4->super_QFragment<3>).parent != 0) && (bVar5 = true, local_18 != 0)) {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_18);
      bVar5 = (pQVar4->super_QFragment<3>).color == 1;
    }
    if (!bVar5) goto LAB_007e0a62;
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
    if (local_18 == (pQVar4->super_QFragment<3>).left) {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
      local_48 = (pQVar4->super_QFragment<3>).right;
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
      if ((pQVar4->super_QFragment<3>).color == 0) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
        (pQVar4->super_QFragment<3>).color = 1;
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
        (pQVar4->super_QFragment<3>).color = 0;
        rotateLeft((QFragmentMapData<QTextBlockData> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
        local_48 = (pQVar4->super_QFragment<3>).right;
      }
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
      if ((pQVar4->super_QFragment<3>).left != 0) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).left);
        if ((pQVar4->super_QFragment<3>).color != 1) break;
      }
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
      if ((pQVar4->super_QFragment<3>).right != 0) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).right);
        if ((pQVar4->super_QFragment<3>).color != 1) break;
      }
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
      (pQVar4->super_QFragment<3>).color = 0;
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
      local_1c = (pQVar4->super_QFragment<3>).parent;
    }
    else {
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
      local_4c = (pQVar4->super_QFragment<3>).left;
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
      if ((pQVar4->super_QFragment<3>).color == 0) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
        (pQVar4->super_QFragment<3>).color = 1;
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
        (pQVar4->super_QFragment<3>).color = 0;
        rotateRight((QFragmentMapData<QTextBlockData> *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
        local_4c = (pQVar4->super_QFragment<3>).left;
      }
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
      if ((pQVar4->super_QFragment<3>).right != 0) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).right);
        if ((pQVar4->super_QFragment<3>).color == 1) goto LAB_007e089e;
LAB_007e0915:
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
        if ((pQVar4->super_QFragment<3>).left == 0) {
LAB_007e094e:
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
          if ((pQVar4->super_QFragment<3>).right != 0) {
            pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
            pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).right
                      );
            (pQVar4->super_QFragment<3>).color = 1;
          }
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
          (pQVar4->super_QFragment<3>).color = 0;
          F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
          rotateLeft((QFragmentMapData<QTextBlockData> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c);
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
          local_4c = (pQVar4->super_QFragment<3>).left;
        }
        else {
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).left);
          if ((pQVar4->super_QFragment<3>).color == 1) goto LAB_007e094e;
        }
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
        qVar6 = (pQVar4->super_QFragment<3>).color;
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
        (pQVar4->super_QFragment<3>).color = qVar6;
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
        (pQVar4->super_QFragment<3>).color = 1;
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
        if ((pQVar4->super_QFragment<3>).left != 0) {
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
          pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).left);
          (pQVar4->super_QFragment<3>).color = 1;
        }
        rotateRight((QFragmentMapData<QTextBlockData> *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    in_stack_ffffffffffffff7c);
        goto LAB_007e0a62;
      }
LAB_007e089e:
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
      if ((pQVar4->super_QFragment<3>).left != 0) {
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
        pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).left);
        if ((pQVar4->super_QFragment<3>).color != 1) goto LAB_007e0915;
      }
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_4c);
      (pQVar4->super_QFragment<3>).color = 0;
      pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
      local_1c = (pQVar4->super_QFragment<3>).parent;
    }
    local_18 = uVar1;
  } while( true );
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
  if ((pQVar4->super_QFragment<3>).right != 0) {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).right);
    if ((pQVar4->super_QFragment<3>).color != 1) goto LAB_007e0751;
  }
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
  if ((pQVar4->super_QFragment<3>).left != 0) {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).left);
    (pQVar4->super_QFragment<3>).color = 1;
  }
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
  (pQVar4->super_QFragment<3>).color = 0;
  F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
  rotateRight((QFragmentMapData<QTextBlockData> *)
              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
              in_stack_ffffffffffffff7c);
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
  local_48 = (pQVar4->super_QFragment<3>).right;
LAB_007e0751:
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
  qVar6 = (pQVar4->super_QFragment<3>).color;
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
  (pQVar4->super_QFragment<3>).color = qVar6;
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_1c);
  (pQVar4->super_QFragment<3>).color = 1;
  pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
  if ((pQVar4->super_QFragment<3>).right != 0) {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_48);
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar4->super_QFragment<3>).right);
    (pQVar4->super_QFragment<3>).color = 1;
  }
  rotateLeft((QFragmentMapData<QTextBlockData> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
            );
LAB_007e0a62:
  if (local_18 != 0) {
    pQVar4 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_18);
    (pQVar4->super_QFragment<3>).color = 1;
  }
  return uVar3;
}

Assistant:

uint QFragmentMapData<Fragment>::erase_single(uint z)
{
    uint w = previous(z);
    uint y = z;
    uint x;
    uint p;

    if (!F(y).left) {
        x = F(y).right;
    } else if (!F(y).right) {
        x = F(y).left;
    } else {
        y = F(y).right;
        while (F(y).left)
            y = F(y).left;
        x = F(y).right;
    }

    if (y != z) {
        F(F(z).left).parent = y;
        F(y).left = F(z).left;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_left_array[field];
        if (y != F(z).right) {
            /*
                     z                y
                    / \              / \
                   a   b            a   b
                      /                /
                    ...     -->      ...
                    /                /
                   y                x
                  / \
                 0   x
             */
            p = F(y).parent;
            if (x)
                F(x).parent = p;
            F(p).left = x;
            F(y).right = F(z).right;
            F(F(z).right).parent = y;
            uint n = p;
            while (n != y) {
                for (uint field = 0; field < Fragment::size_array_max; ++field)
                    F(n).size_left_array[field] -= F(y).size_array[field];
                n = F(n).parent;
            }
        } else {
            /*
                     z                y
                    / \              / \
                   a   y     -->    a   x
                      / \
                     0   x
             */
            p = y;
        }
        uint zp = F(z).parent;
        if (!zp) {
            Q_ASSERT(head->root == z);
            head->root = y;
        } else if (F(zp).left == z) {
            F(zp).left = y;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(zp).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(zp).right = y;
        }
        F(y).parent = zp;
        // Swap the colors
        uint c = F(y).color;
        F(y).color = F(z).color;
        F(z).color = c;
        y = z;
    } else {
        /*
                p          p            p          p
               /          /              \          \
              z    -->   x                z  -->     x
              |                           |
              x                           x
         */
        p = F(z).parent;
        if (x)
            F(x).parent = p;
        if (!p) {
            Q_ASSERT(head->root == z);
            head->root = x;
        } else if (F(p).left == z) {
            F(p).left = x;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(p).right = x;
        }
    }
    uint n = z;
    while (F(n).parent) {
        uint p = F(n).parent;
        if (F(p).left == n) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        }
        n = p;
    }

    freeFragment(z);


    if (F(y).color != Red) {
        while (F(x).parent && (x == 0 || F(x).color == Black)) {
            if (x == F(p).left) {
                uint w = F(p).right;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateLeft(p);
                    w = F(p).right;
                }
                if ((F(w).left == 0 || F(F(w).left).color == Black) &&
                    (F(w).right == 0 || F(F(w).right).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).right == 0 || F(F(w).right).color == Black) {
                        if (F(w).left)
                            F(F(w).left).color = Black;
                        F(w).color = Red;
                        rotateRight(F(p).right);
                        w = F(p).right;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).right)
                        F(F(w).right).color = Black;
                    rotateLeft(p);
                    break;
                }
            } else {
                uint w = F(p).left;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateRight(p);
                    w = F(p).left;
                }
                if ((F(w).right == 0 || F(F(w).right).color == Black) &&
                    (F(w).left == 0 || F(F(w).left).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).left == 0 || F(F(w).left).color == Black) {
                        if (F(w).right)
                            F(F(w).right).color = Black;
                        F(w).color = Red;
                        rotateLeft(F(p).left);
                        w = F(p).left;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).left)
                        F(F(w).left).color = Black;
                    rotateRight(p);
                    break;
                }
            }
        }
        if (x)
            F(x).color = Black;
    }

    return w;
}